

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O1

int * Kit_TruthStatsArray(uint *pArray,int nVars,int nFuncs)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *vMemory;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  
  piVar2 = (int *)calloc((long)nFuncs,4);
  vMemory = (Vec_Int_t *)malloc(0x10);
  vMemory->nCap = 0x10000;
  vMemory->nSize = 0;
  piVar3 = (int *)malloc(0x40000);
  vMemory->pArray = piVar3;
  if (0 < nFuncs) {
    uVar4 = 0;
    uVar5 = (ulong)(nVars - 5);
    if (nVars < 6) {
      uVar5 = uVar4;
    }
    do {
      iVar1 = Kit_TruthStats(pArray + ((int)uVar4 << ((byte)uVar5 & 0x1f)),nVars,vMemory);
      piVar2[uVar4] = iVar1;
      uVar4 = uVar4 + 1;
    } while ((uint)nFuncs != uVar4);
  }
  if (vMemory->pArray != (int *)0x0) {
    free(vMemory->pArray);
    vMemory->pArray = (int *)0x0;
  }
  free(vMemory);
  return piVar2;
}

Assistant:

int * Kit_TruthStatsArray( unsigned * pArray, int nVars, int nFuncs )
{
    int f, * pRes = ABC_CALLOC( int, nFuncs );
    int nInts = Abc_TruthWordNum( nVars );
    Vec_Int_t * vMemory = Vec_IntAlloc( 1 << 16 );
    for ( f = 0; f < nFuncs; f++ )
        pRes[f] = Kit_TruthStats( pArray + f*nInts, nVars, vMemory );
    Vec_IntFree( vMemory );
    return pRes;
}